

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

cio_error cio_uart_set_baud_rate(cio_uart *port,cio_uart_baud_rate baud_rate)

{
  int *piVar1;
  int local_60;
  int ret;
  cio_error err;
  termios tty;
  cio_uart_baud_rate baud_rate_local;
  cio_uart *port_local;
  
  if (port == (cio_uart *)0x0) {
    port_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    tty.c_ispeed = baud_rate;
    unique0x100003cd = port;
    port_local._4_4_ = get_current_settings(port,(termios *)&ret);
    if (port_local._4_4_ == CIO_SUCCESS) {
      switch(tty.c_ispeed) {
      case 0:
        local_60 = cfsetspeed((termios *)&ret,1);
        break;
      case 1:
        local_60 = cfsetspeed((termios *)&ret,2);
        break;
      case 2:
        local_60 = cfsetspeed((termios *)&ret,3);
        break;
      case 3:
        local_60 = cfsetspeed((termios *)&ret,4);
        break;
      case 4:
        local_60 = cfsetspeed((termios *)&ret,5);
        break;
      case 5:
        local_60 = cfsetspeed((termios *)&ret,6);
        break;
      case 6:
        local_60 = cfsetspeed((termios *)&ret,7);
        break;
      case 7:
        local_60 = cfsetspeed((termios *)&ret,8);
        break;
      case 8:
        local_60 = cfsetspeed((termios *)&ret,9);
        break;
      case 9:
        local_60 = cfsetspeed((termios *)&ret,10);
        break;
      case 10:
        local_60 = cfsetspeed((termios *)&ret,0xb);
        break;
      case 0xb:
        local_60 = cfsetspeed((termios *)&ret,0xc);
        break;
      case 0xc:
        local_60 = cfsetspeed((termios *)&ret,0xd);
        break;
      case 0xd:
        local_60 = cfsetspeed((termios *)&ret,0xe);
        break;
      case 0xe:
        local_60 = cfsetspeed((termios *)&ret,0xf);
        break;
      case 0xf:
        local_60 = cfsetspeed((termios *)&ret,0x1001);
        break;
      case 0x10:
        local_60 = cfsetspeed((termios *)&ret,0x1002);
        break;
      case 0x11:
        local_60 = cfsetspeed((termios *)&ret,0x1003);
        break;
      case 0x12:
        local_60 = cfsetspeed((termios *)&ret,0x1004);
        break;
      case 0x13:
        local_60 = cfsetspeed((termios *)&ret,0x1005);
        break;
      case 0x14:
        local_60 = cfsetspeed((termios *)&ret,0x1006);
        break;
      case 0x15:
        local_60 = cfsetspeed((termios *)&ret,0x1007);
        break;
      case 0x16:
        local_60 = cfsetspeed((termios *)&ret,0x1008);
        break;
      case 0x17:
        local_60 = cfsetspeed((termios *)&ret,0x1009);
        break;
      case 0x18:
        local_60 = cfsetspeed((termios *)&ret,0x100a);
        break;
      case 0x19:
        local_60 = cfsetspeed((termios *)&ret,0x100b);
        break;
      case 0x1a:
        local_60 = cfsetspeed((termios *)&ret,0x100c);
        break;
      case 0x1b:
        local_60 = cfsetspeed((termios *)&ret,0x100d);
        break;
      case 0x1c:
        local_60 = cfsetspeed((termios *)&ret,0x100e);
        break;
      case 0x1d:
        local_60 = cfsetspeed((termios *)&ret,0x100f);
        break;
      default:
        return CIO_INVALID_ARGUMENT;
      }
      if (local_60 == -1) {
        piVar1 = __errno_location();
        port_local._4_4_ = -*piVar1;
      }
      else {
        port_local._4_4_ = set_termios((stack0xffffffffffffffe8->impl).ev.fd,(termios *)&ret);
        if (port_local._4_4_ == CIO_SUCCESS) {
          port_local._4_4_ = CIO_SUCCESS;
        }
      }
    }
  }
  return port_local._4_4_;
}

Assistant:

enum cio_error cio_uart_set_baud_rate(const struct cio_uart *port, enum cio_uart_baud_rate baud_rate)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	int ret = 0;
	switch (baud_rate) {
	case CIO_UART_BAUD_RATE_50:
		ret = cfsetspeed(&tty, (speed_t)B50);
		break;
	case CIO_UART_BAUD_RATE_75:
		ret = cfsetspeed(&tty, (speed_t)B75);
		break;
	case CIO_UART_BAUD_RATE_110:
		ret = cfsetspeed(&tty, (speed_t)B110);
		break;
	case CIO_UART_BAUD_RATE_134:
		ret = cfsetspeed(&tty, (speed_t)B134);
		break;
	case CIO_UART_BAUD_RATE_150:
		ret = cfsetspeed(&tty, (speed_t)B150);
		break;
	case CIO_UART_BAUD_RATE_200:
		ret = cfsetspeed(&tty, (speed_t)B200);
		break;
	case CIO_UART_BAUD_RATE_300:
		ret = cfsetspeed(&tty, (speed_t)B300);
		break;
	case CIO_UART_BAUD_RATE_600:
		ret = cfsetspeed(&tty, (speed_t)B600);
		break;
	case CIO_UART_BAUD_RATE_1200:
		ret = cfsetspeed(&tty, (speed_t)B1200);
		break;
	case CIO_UART_BAUD_RATE_1800:
		ret = cfsetspeed(&tty, (speed_t)B1800);
		break;
	case CIO_UART_BAUD_RATE_2400:
		ret = cfsetspeed(&tty, (speed_t)B2400);
		break;
	case CIO_UART_BAUD_RATE_4800:
		ret = cfsetspeed(&tty, (speed_t)B4800);
		break;
	case CIO_UART_BAUD_RATE_9600:
		ret = cfsetspeed(&tty, (speed_t)B9600);
		break;
	case CIO_UART_BAUD_RATE_19200:
		ret = cfsetspeed(&tty, (speed_t)B19200);
		break;
	case CIO_UART_BAUD_RATE_38400:
		ret = cfsetspeed(&tty, (speed_t)B38400);
		break;
	case CIO_UART_BAUD_RATE_57600:
		ret = cfsetspeed(&tty, (speed_t)B57600);
		break;
	case CIO_UART_BAUD_RATE_115200:
		ret = cfsetspeed(&tty, (speed_t)B115200);
		break;
	case CIO_UART_BAUD_RATE_230400:
		ret = cfsetspeed(&tty, (speed_t)B230400);
		break;
	case CIO_UART_BAUD_RATE_460800:
		ret = cfsetspeed(&tty, (speed_t)B460800);
		break;
	case CIO_UART_BAUD_RATE_500000:
		ret = cfsetspeed(&tty, (speed_t)B500000);
		break;
	case CIO_UART_BAUD_RATE_576000:
		ret = cfsetspeed(&tty, (speed_t)B576000);
		break;
	case CIO_UART_BAUD_RATE_921600:
		ret = cfsetspeed(&tty, (speed_t)B921600);
		break;
	case CIO_UART_BAUD_RATE_1000000:
		ret = cfsetspeed(&tty, (speed_t)B1000000);
		break;
	case CIO_UART_BAUD_RATE_1152000:
		ret = cfsetspeed(&tty, (speed_t)B1152000);
		break;
	case CIO_UART_BAUD_RATE_1500000:
		ret = cfsetspeed(&tty, (speed_t)B1500000);
		break;
	case CIO_UART_BAUD_RATE_2000000:
		ret = cfsetspeed(&tty, (speed_t)B2000000);
		break;
	case CIO_UART_BAUD_RATE_2500000:
		ret = cfsetspeed(&tty, (speed_t)B2500000);
		break;
	case CIO_UART_BAUD_RATE_3000000:
		ret = cfsetspeed(&tty, (speed_t)B3000000);
		break;
	case CIO_UART_BAUD_RATE_3500000:
		ret = cfsetspeed(&tty, (speed_t)B3500000);
		break;
	case CIO_UART_BAUD_RATE_4000000:
		ret = cfsetspeed(&tty, (speed_t)B4000000);
		break;
	default:
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely(ret == -1)) {
		return (enum cio_error)(-errno);
	}

	err = set_termios(port->impl.ev.fd, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	return CIO_SUCCESS;
}